

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O2

int Cbs_ManSolve_rec(Cbs_Man_t *p,int Level)

{
  Cbs_Que_t *p_00;
  int *piVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  Gia_Obj_t **ppGVar9;
  Gia_Obj_t *pGVar10;
  int iVar11;
  Gia_Obj_t *pGVar12;
  int i_1;
  long lVar13;
  int i;
  long lVar14;
  Gia_Obj_t *pObjMax;
  bool bVar15;
  
  if ((p->pProp).iHead == (p->pProp).iTail) {
    __assert_fail("!Cbs_QueIsEmpty(&p->pProp)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat.c"
                  ,0x372,"int Cbs_ManSolve_rec(Cbs_Man_t *, int)");
  }
  iVar5 = Cbs_ManPropagate(p,Level);
  if (iVar5 == 0) {
    iVar8 = (p->pProp).iHead;
    if (iVar8 != (p->pProp).iTail) {
      __assert_fail("Cbs_QueIsEmpty(&p->pProp)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat.c"
                    ,0x376,"int Cbs_ManSolve_rec(Cbs_Man_t *, int)");
    }
    iVar2 = (p->pJust).iHead;
    iVar3 = (p->pJust).iTail;
    iVar6 = iVar3 - iVar2;
    iVar5 = 0;
    if (iVar6 != 0) {
      iVar11 = (p->Pars).nJustThis;
      if (iVar6 < iVar11) {
        iVar6 = iVar11;
      }
      (p->Pars).nJustThis = iVar6;
      iVar6 = Cbs_ManCheckLimits(p);
      if (iVar6 == 0) {
        lVar13 = (long)iVar3;
        for (lVar14 = (long)iVar2; lVar14 < lVar13; lVar14 = lVar14 + 1) {
          Cbs_QuePush(&p->pJust,(p->pJust).pData[lVar14]);
        }
        (p->pJust).iHead = iVar3;
        if ((p->Pars).fUseHighest == 0) {
          if ((p->Pars).fUseLowest == 0) {
            if ((p->Pars).fUseMaxFF == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat.c"
                            ,0x387,"int Cbs_ManSolve_rec(Cbs_Man_t *, int)");
            }
            if (p->pAig->pRefs == (int *)0x0) {
              __assert_fail("p->pAig->pRefs != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat.c"
                            ,0x1c7,"Gia_Obj_t *Cbs_ManDecideMaxFF(Cbs_Man_t *)");
            }
            pGVar12 = (Gia_Obj_t *)0x0;
            iVar5 = 0;
            for (; (lVar13 < (p->pJust).iTail &&
                   (pGVar4 = (p->pJust).pData[lVar13], pGVar4 != (Gia_Obj_t *)0x0));
                lVar13 = lVar13 + 1) {
              if (((ulong)pGVar4 & 1) != 0) {
                __assert_fail("!Gia_IsComplement(pObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat.c"
                              ,0x187,"int Cbs_VarFaninFanoutMax(Cbs_Man_t *, Gia_Obj_t *)");
              }
              if (((int)(uint)*(undefined8 *)pGVar4 < 0) ||
                 (uVar7 = (uint)*(undefined8 *)pGVar4 & 0x1fffffff, uVar7 == 0x1fffffff)) {
                __assert_fail("Gia_ObjIsAnd(pObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat.c"
                              ,0x188,"int Cbs_VarFaninFanoutMax(Cbs_Man_t *, Gia_Obj_t *)");
              }
              iVar11 = Gia_ObjRefNum(p->pAig,pGVar4 + -(ulong)uVar7);
              iVar6 = Gia_ObjRefNum(p->pAig,pGVar4 + -(ulong)(*(uint *)&pGVar4->field_0x4 &
                                                             0x1fffffff));
              if (iVar6 < iVar11) {
                iVar6 = iVar11;
              }
              if (iVar6 < 1) {
                __assert_fail("iCurFF > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat.c"
                              ,0x1cb,"Gia_Obj_t *Cbs_ManDecideMaxFF(Cbs_Man_t *)");
              }
              iVar11 = iVar5;
              if (iVar5 <= iVar6) {
                iVar11 = iVar6;
              }
              if (iVar5 < iVar6) {
                pGVar12 = pGVar4;
              }
              iVar5 = iVar11;
            }
          }
          else {
            pGVar12 = (Gia_Obj_t *)0x0;
            for (; (lVar13 < (p->pJust).iTail &&
                   (pGVar4 = (p->pJust).pData[lVar13], pGVar4 != (Gia_Obj_t *)0x0));
                lVar13 = lVar13 + 1) {
              pGVar10 = pGVar12;
              if (pGVar4 < pGVar12) {
                pGVar10 = pGVar4;
              }
              bVar15 = pGVar12 == (Gia_Obj_t *)0x0;
              pGVar12 = pGVar10;
              if (bVar15) {
                pGVar12 = pGVar4;
              }
            }
          }
        }
        else {
          pGVar12 = (Gia_Obj_t *)0x0;
          for (; (lVar13 < (p->pJust).iTail &&
                 (pGVar4 = (p->pJust).pData[lVar13], pGVar4 != (Gia_Obj_t *)0x0));
              lVar13 = lVar13 + 1) {
            if (pGVar12 < pGVar4) {
              pGVar12 = pGVar4;
            }
          }
        }
        iVar5 = Cbs_VarIsJust(pGVar12);
        if (iVar5 == 0) {
          __assert_fail("Cbs_VarIsJust( pVar )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat.c"
                        ,0x388,"int Cbs_ManSolve_rec(Cbs_Man_t *, int)");
        }
        iVar5 = Gia_ObjRefNum(p->pAig,pGVar12 + -(*(ulong *)pGVar12 & 0x1fffffff));
        iVar6 = Gia_ObjRefNum(p->pAig,pGVar12 + -((ulong)*(uint *)&pGVar12->field_0x4 & 0x1fffffff))
        ;
        if (iVar6 < iVar5) {
          pGVar12 = (Gia_Obj_t *)
                    ((ulong)((uint)*(undefined8 *)pGVar12 >> 0x1d & 1) ^
                    (ulong)(pGVar12 + -(ulong)((uint)*(undefined8 *)pGVar12 & 0x1fffffff)));
        }
        else {
          pGVar12 = Gia_ObjChild1(pGVar12);
        }
        iVar11 = Level + 1;
        Cbs_ManAssign(p,(Gia_Obj_t *)((ulong)pGVar12 ^ 1),iVar11,(Gia_Obj_t *)0x0,(Gia_Obj_t *)0x0);
        iVar6 = Cbs_ManSolve_rec(p,iVar11);
        iVar5 = 0;
        if (iVar6 != 0) {
          lVar13 = (long)iVar6;
          pGVar4 = (p->pClauses).pData[lVar13];
          iVar5 = iVar6;
          if (pGVar4 == (Gia_Obj_t *)((ulong)pGVar12 & 0xfffffffffffffffe)) {
            Cbs_ManCancelUntil(p,iVar8);
            (p->pJust).iHead = iVar2;
            (p->pJust).iTail = iVar3;
            Cbs_ManAssign(p,pGVar12,iVar11,(Gia_Obj_t *)0x0,(Gia_Obj_t *)0x0);
            iVar8 = Cbs_ManSolve_rec(p,iVar11);
            iVar5 = 0;
            if (iVar8 != 0) {
              ppGVar9 = (p->pClauses).pData;
              lVar14 = (long)iVar8;
              iVar5 = iVar8;
              if (ppGVar9[lVar14] == pGVar4) {
                pGVar12 = ppGVar9[lVar13];
                if (pGVar12 == (Gia_Obj_t *)0x0) {
                  __assert_fail("pQue->pData[hClause0] != NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat.c"
                                ,0x2b9,"int Cbs_ManResolve(Cbs_Man_t *, int, int, int)");
                }
                if (pGVar12 == pGVar4) {
                  if ((p->pClauses).iHead != (p->pClauses).iTail) {
                    __assert_fail("Cbs_QueIsEmpty( pQue )",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat.c"
                                  ,0x2c1,"int Cbs_ManResolve(Cbs_Man_t *, int, int, int)");
                  }
                  p_00 = &p->pClauses;
                  Cbs_QuePush(p_00,(Gia_Obj_t *)0x0);
                  iVar5 = -1;
                  do {
                    ppGVar9 = (p->pClauses).pData;
                    do {
                      pGVar12 = ppGVar9[lVar13 + 1];
                      if (pGVar12 == (Gia_Obj_t *)0x0) {
                        while (pGVar12 = ppGVar9[lVar14 + 1], pGVar12 != (Gia_Obj_t *)0x0) {
                          lVar14 = lVar14 + 1;
                          if (((uint)*(ulong *)pGVar12 >> 0x1e & 1) != 0) {
                            *(ulong *)pGVar12 = *(ulong *)pGVar12 & 0xffffffffbfffffff;
                            Cbs_QuePush(p_00,pGVar12);
                            iVar8 = Cbs_VarDecLevel(p,pGVar12);
                            if (iVar5 <= iVar8) {
                              iVar5 = iVar8;
                            }
                            ppGVar9 = (p->pClauses).pData;
                          }
                        }
                        lVar13 = (long)p_00->iHead;
                        while (lVar13 = lVar13 + 1, lVar13 < (p->pClauses).iTail) {
                          pGVar12 = (p->pClauses).pData[lVar13];
                          *(ulong *)pGVar12 = *(ulong *)pGVar12 | 0x40000000;
                        }
                        Cbs_ManDeriveReason(p,iVar5);
                        iVar5 = Cbs_QueFinish(p_00);
                        piVar1 = &(p->Pars).nBTThis;
                        *piVar1 = *piVar1 + 1;
                        return iVar5;
                      }
                      lVar13 = lVar13 + 1;
                    } while (((uint)*(ulong *)pGVar12 >> 0x1e & 1) == 0);
                    *(ulong *)pGVar12 = *(ulong *)pGVar12 & 0xffffffffbfffffff;
                    Cbs_QuePush(p_00,pGVar12);
                    iVar8 = Cbs_VarDecLevel(p,pGVar12);
                    if (iVar5 <= iVar8) {
                      iVar5 = iVar8;
                    }
                  } while( true );
                }
                __assert_fail("pQue->pData[hClause0] == pQue->pData[hClause1]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat.c"
                              ,0x2ba,"int Cbs_ManResolve(Cbs_Man_t *, int, int, int)");
              }
            }
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int Cbs_ManSolve_rec( Cbs_Man_t * p, int Level )
{ 
    Cbs_Que_t * pQue = &(p->pClauses);
    Gia_Obj_t * pVar = NULL, * pDecVar;
    int hClause, hLearn0, hLearn1;
    int iPropHead, iJustHead, iJustTail;
    // propagate assignments
    assert( !Cbs_QueIsEmpty(&p->pProp) );
    if ( (hClause = Cbs_ManPropagate( p, Level )) )
        return hClause;
    // check for satisfying assignment
    assert( Cbs_QueIsEmpty(&p->pProp) );
    if ( Cbs_QueIsEmpty(&p->pJust) )
        return 0;
    // quit using resource limits
    p->Pars.nJustThis = Abc_MaxInt( p->Pars.nJustThis, p->pJust.iTail - p->pJust.iHead );
    if ( Cbs_ManCheckLimits( p ) )
        return 0;
    // remember the state before branching
    iPropHead = p->pProp.iHead;
    Cbs_QueStore( &p->pJust, &iJustHead, &iJustTail );
    // find the decision variable
    if ( p->Pars.fUseHighest )
        pVar = Cbs_ManDecideHighest( p );
    else if ( p->Pars.fUseLowest )
        pVar = Cbs_ManDecideLowest( p );
    else if ( p->Pars.fUseMaxFF )
        pVar = Cbs_ManDecideMaxFF( p );
    else assert( 0 );
    assert( Cbs_VarIsJust( pVar ) );
    // chose decision variable using fanout count
    if ( Gia_ObjRefNum(p->pAig, Gia_ObjFanin0(pVar)) > Gia_ObjRefNum(p->pAig, Gia_ObjFanin1(pVar)) )
        pDecVar = Gia_Not(Gia_ObjChild0(pVar));
    else
        pDecVar = Gia_Not(Gia_ObjChild1(pVar));
//    pDecVar = Gia_NotCond( Gia_Regular(pDecVar), Gia_Regular(pDecVar)->fPhase );
//    pDecVar = Gia_Not(pDecVar);
    // decide on first fanin
    Cbs_ManAssign( p, pDecVar, Level+1, NULL, NULL );
    if ( !(hLearn0 = Cbs_ManSolve_rec( p, Level+1 )) )
        return 0;
    if ( pQue->pData[hLearn0] != Gia_Regular(pDecVar) )
        return hLearn0;
    Cbs_ManCancelUntil( p, iPropHead );
    Cbs_QueRestore( &p->pJust, iJustHead, iJustTail );
    // decide on second fanin
    Cbs_ManAssign( p, Gia_Not(pDecVar), Level+1, NULL, NULL );
    if ( !(hLearn1 = Cbs_ManSolve_rec( p, Level+1 )) )
        return 0;
    if ( pQue->pData[hLearn1] != Gia_Regular(pDecVar) )
        return hLearn1;
    hClause = Cbs_ManResolve( p, Level, hLearn0, hLearn1 );
//    Cbs_ManPrintClauseNew( p, Level, hClause );
//    if ( Level > Cbs_ClauseDecLevel(p, hClause) )
//        p->Pars.nBTThisNc++;
    p->Pars.nBTThis++;
    return hClause;
}